

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

int __thiscall spdlog::details::file_helper::close(file_helper *this,int __fd)

{
  bool bVar1;
  undefined7 extraout_var;
  file_helper *extraout_RAX;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
  *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  _IO_FILE *this_00;
  file_helper *__args;
  
  if (this->fd_ != (FILE *)0x0) {
    __args = this;
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
                        *)0x6f2660);
    this_00 = (_IO_FILE *)this;
    if (bVar1) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
      ::operator()(unaff_retaddr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                   (_IO_FILE *)this);
      this_00 = (_IO_FILE *)this;
    }
    fclose((FILE *)this_00->_IO_read_ptr);
    this_00->_IO_read_ptr = (char *)0x0;
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)0x6f26ae);
    this = (file_helper *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      CLI::std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)this_00,in_stack_ffffffffffffffe8);
      this = extraout_RAX;
    }
  }
  return (int)this;
}

Assistant:

SPDLOG_INLINE void file_helper::close() {
    if (fd_ != nullptr) {
        if (event_handlers_.before_close) {
            event_handlers_.before_close(filename_, fd_);
        }

        std::fclose(fd_);
        fd_ = nullptr;

        if (event_handlers_.after_close) {
            event_handlers_.after_close(filename_);
        }
    }
}